

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true> __thiscall
duckdb::DataTable::InitializeDelete
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  size_type *this_00;
  pointer puVar1;
  DataTableInfo *this_01;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar2;
  pointer pCVar3;
  ForeignKeyConstraint *pFVar4;
  pointer pTVar5;
  reference pvVar6;
  storage_t *__args;
  LogicalType *__args_00;
  Allocator *allocator;
  ClientContext *__p;
  NotImplementedException *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  idx_t i;
  pointer this_03;
  ulong __n;
  allocator local_99;
  vector<duckdb::LogicalType,_true> types;
  shared_ptr<duckdb::Binder,_true> binder;
  string local_50;
  
  this_01 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                      ((shared_ptr<duckdb::DataTableInfo,_true> *)
                       &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.set);
  DataTableInfo::InitializeIndexes(this_01,(ClientContext *)bound_constraints,(char *)0x0);
  Binder::CreateBinder
            ((Binder *)&binder,(ClientContext *)bound_constraints,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_uniq<duckdb::TableDeleteState>();
  pvVar2 = TableCatalogEntry::GetConstraints((TableCatalogEntry *)context);
  puVar1 = (pvVar2->
           super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = (pvVar2->
                 super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar1; this_03 = this_03 + 1
      ) {
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_03);
    if (2 < pCVar3->type - 1) {
      if (pCVar3->type != FOREIGN_KEY) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Constraint type not implemented!",&local_99);
        NotImplementedException::NotImplementedException(this_02,&local_50);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_03);
      pFVar4 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar3);
      if (((pFVar4->info).type & ~FK_TYPE_SELF_REFERENCE_TABLE) == FK_TYPE_PRIMARY_KEY_TABLE) break;
    }
  }
  pTVar5 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
           ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                         *)this);
  pTVar5->has_delete_constraints = this_03 != puVar1;
  pTVar5 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
           ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                         *)this);
  if (pTVar5->has_delete_constraints == true) {
    this_00 = &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
               _M_string_length;
    for (__n = 0; __n < (ulong)((long)((table->super_StandardEntry).super_InCatalogEntry.
                                       super_CatalogEntry.name.field_2._M_allocated_capacity -
                                      (table->super_StandardEntry).super_InCatalogEntry.
                                      super_CatalogEntry.name._M_string_length) / 0xd8);
        __n = __n + 1) {
      pTVar5 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
               ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                             *)this);
      pvVar6 = vector<duckdb::ColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ColumnDefinition,_true> *)this_00,__n);
      __args = ColumnDefinition::StorageOid(pvVar6);
      ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
      emplace_back<unsigned_long_const&>
                ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)
                 &pTVar5->col_ids,__args);
      pvVar6 = vector<duckdb::ColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ColumnDefinition,_true> *)this_00,__n);
      __args_00 = ColumnDefinition::Type(pvVar6);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,__args_00
                );
    }
    pTVar5 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
             ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)this);
    allocator = Allocator::Get((ClientContext *)bound_constraints);
    DataChunk::Initialize(&pTVar5->verify_chunk,allocator,&types,0x800);
    __p = (ClientContext *)operator_new(0x10);
    (__p->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = context;
    (__p->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_R8;
    local_50._M_dataplus._M_p = (pointer)__p;
    pTVar5 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
             ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)this);
    local_50._M_dataplus._M_p = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
    reset((__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_> *
          )pTVar5,(pointer)__p);
    ::std::unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
    ~unique_ptr((unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                 *)&local_50);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)
         (unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)this;
}

Assistant:

unique_ptr<TableDeleteState> DataTable::InitializeDelete(TableCatalogEntry &table, ClientContext &context,
                                                         const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	// initialize indexes (if any)
	info->InitializeIndexes(context);

	auto binder = Binder::CreateBinder(context);
	vector<LogicalType> types;
	auto result = make_uniq<TableDeleteState>();
	result->has_delete_constraints = TableHasDeleteConstraints(table);
	if (result->has_delete_constraints) {
		// initialize the chunk if there are any constraints to verify
		for (idx_t i = 0; i < column_definitions.size(); i++) {
			result->col_ids.emplace_back(column_definitions[i].StorageOid());
			types.emplace_back(column_definitions[i].Type());
		}
		result->verify_chunk.Initialize(Allocator::Get(context), types);
		result->constraint_state = make_uniq<ConstraintState>(table, bound_constraints);
	}
	return result;
}